

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-oid.c
# Opt level: O2

void test_bson_oid_init(void)

{
  char cVar1;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  int iVar5;
  char *pcVar6;
  bool bVar7;
  bson_oid_t oid;
  bson_oid_t oid2;
  undefined1 auStack_38 [12];
  undefined1 local_2c [12];
  
  uVar3 = bson_context_new(0);
  bson_oid_init(auStack_38,uVar3);
  iVar5 = 10000;
  do {
    bVar7 = iVar5 == 0;
    iVar5 = iVar5 + -1;
    if (bVar7) {
      bson_context_destroy(uVar3);
      bson_oid_init(auStack_38,0);
      lVar4 = bson_context_get_default();
      if (lVar4 != 0) {
        return;
      }
      pcVar6 = "bson_context_get_default ()";
      uVar3 = 0xcb;
LAB_001292b8:
      fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-oid.c"
              ,uVar3,"test_bson_oid_init",pcVar6);
      abort();
    }
    bson_oid_init(local_2c,uVar3);
    cVar1 = bson_oid_equal(auStack_38,local_2c);
    if (cVar1 != '\0') {
      pcVar6 = "false == bson_oid_equal (&oid, &oid2)";
      uVar3 = 0xc1;
      goto LAB_001292b8;
    }
    iVar2 = bson_oid_compare(auStack_38,local_2c);
    if (-1 < iVar2) {
      pcVar6 = "0 > bson_oid_compare (&oid, &oid2)";
      uVar3 = 0xc2;
      goto LAB_001292b8;
    }
    bson_oid_copy(local_2c);
  } while( true );
}

Assistant:

static void
test_bson_oid_init (void)
{
   bson_context_t *context;
   bson_oid_t oid;
   bson_oid_t oid2;
   int i;

   context = bson_context_new (BSON_CONTEXT_NONE);
   bson_oid_init (&oid, context);
   for (i = 0; i < 10000; i++) {
      bson_oid_init (&oid2, context);
      BSON_ASSERT (false == bson_oid_equal (&oid, &oid2));
      BSON_ASSERT (0 > bson_oid_compare (&oid, &oid2));
      bson_oid_copy (&oid2, &oid);
   }
   bson_context_destroy (context);

   /*
    * Test that the shared context works.
    */
   bson_oid_init (&oid, NULL);
   BSON_ASSERT (bson_context_get_default ());
}